

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  
  if (argc == 1) {
    main_repl(1,argv);
    if (deci::nothing_t::Instance()::self == '\0') {
      deci::nothing_t::Instance();
    }
    return 0x11f2c8;
  }
  if (1 < argc) {
    uVar2 = 1;
    do {
      iVar1 = run(argv[uVar2]);
      if (iVar1 != 0) {
        return -1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  if (argc == 1) {
    return main_repl(argc, argv);
  }

  for (int i = 1; i < argc; ++i) {
    if (run(argv[i]) != 0) {
      return -1;
    }
  }
  return 0;
}